

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O3

void vsencoding::__vseblocks_unpack5(uint32_t *out,uint32_t *in,uint32_t bs)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  if (0x1f < bs + 0x1f) {
    auVar3 = vpmovsxbd_avx(ZEXT416(0x1010303));
    auVar4 = vpmovsxbd_avx(ZEXT416(0x1e1e1818));
    auVar14 = vpbroadcastd_avx512f(ZEXT416(0x1f));
    auVar15 = vpmovsxbd_avx512f(_DAT_00194330);
    auVar16 = vpmovsxbd_avx512f(_DAT_00194340);
    auVar7 = vpmovsxbd_avx2(ZEXT816(0x3080d12171c0106));
    auVar5 = vpmovsxbd_avx(ZEXT416(0xf14191e));
    auVar6 = vpmovsxbd_avx(ZEXT416(0x50a));
    uVar12 = bs + 0x1f >> 5;
    do {
      uVar1 = *(ulong *)in;
      uVar2 = *(ulong *)((long)in + 8);
      uVar11 = *(ulong *)((long)in + 0x10);
      in = (uint32_t *)((long)in + 0x14);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar1;
      auVar21 = vpshufd_avx(auVar21,0x50);
      auVar17 = vpermt2d_avx512f(ZEXT864(uVar1),auVar15,ZEXT864(uVar2));
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar2;
      auVar22 = vpshufd_avx(auVar22,0x50);
      *out = (uint)(uVar1 >> 0x1b) & 0x1f;
      auVar21 = vpsllvd_avx2(auVar21,auVar3);
      auVar8 = vpermq_avx2(ZEXT1632(auVar22),0x54);
      auVar21 = vpand_avx(auVar21,auVar4);
      auVar10 = vpsrlvd_avx2(auVar8,auVar7);
      auVar18 = vshufi64x2_avx512f(ZEXT1664(auVar21),ZEXT1664(auVar21),0);
      auVar17 = vpsrlvd_avx512f(auVar17,auVar16);
      auVar19 = vpandd_avx512f(auVar17,auVar14);
      auVar17 = vpord_avx512f(auVar17,auVar18);
      auVar18._0_20_ = auVar19._0_20_;
      auVar18._20_4_ = auVar17._20_4_;
      auVar18._24_4_ = auVar19._24_4_;
      auVar18._28_4_ = auVar19._28_4_;
      auVar18._32_4_ = auVar19._32_4_;
      auVar18._36_4_ = auVar19._36_4_;
      auVar18._40_4_ = auVar19._40_4_;
      auVar18._44_4_ = auVar17._44_4_;
      auVar18._48_4_ = auVar19._48_4_;
      auVar18._52_4_ = auVar19._52_4_;
      auVar18._56_4_ = auVar19._56_4_;
      auVar18._60_4_ = auVar19._60_4_;
      auVar20 = auVar14._0_16_;
      auVar21 = vpinsrd_avx(auVar20,((uint)uVar2 & 1) << 4,2);
      auVar8 = vpand_avx2(auVar10,auVar14._0_32_);
      auVar10 = vpor_avx2(auVar10,ZEXT1632(auVar21));
      auVar17 = vmovdqu64_avx512f(auVar18);
      *(undefined1 (*) [64])(out + 1) = auVar17;
      auVar21 = vpinsrd_avx(auVar20,((uint)(uVar2 >> 0x20) & 7) << 2,0);
      auVar8 = vpblendd_avx2(auVar8,auVar10,4);
      *(undefined1 (*) [32])(out + 0x11) = auVar8;
      auVar13 = vpbroadcastd_avx512vl();
      auVar22 = vpsrlvd_avx2(auVar13,auVar5);
      auVar9 = vpsrlvd_avx2(auVar13,auVar6);
      auVar13 = vpor_avx(auVar22,auVar21);
      auVar21 = vpand_avx(auVar22,auVar20);
      auVar22 = vpand_avx(auVar9,auVar20);
      auVar21 = vpblendd_avx2(auVar21,auVar13,1);
      *(undefined1 (*) [16])(out + 0x19) = auVar21;
      *(long *)(out + 0x1d) = auVar22._0_8_;
      out[0x1f] = (uint)uVar11 & 0x1f;
      out = out + 0x20;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

void __vseblocks_unpack5(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 5, --bs) {
    out[0] = in[0] >> 27;
    out[1] = (in[0] >> 22) & 0x1f;
    out[2] = (in[0] >> 17) & 0x1f;
    out[3] = (in[0] >> 12) & 0x1f;
    out[4] = (in[0] >> 7) & 0x1f;
    out[5] = (in[0] >> 2) & 0x1f;
    out[6] = (in[0] << 3) & 0x1f;
    out[6] |= in[1] >> 29;
    out[7] = (in[1] >> 24) & 0x1f;
    out[8] = (in[1] >> 19) & 0x1f;
    out[9] = (in[1] >> 14) & 0x1f;
    out[10] = (in[1] >> 9) & 0x1f;
    out[11] = (in[1] >> 4) & 0x1f;
    out[12] = (in[1] << 1) & 0x1f;
    out[12] |= in[2] >> 0x1f;
    out[13] = (in[2] >> 26) & 0x1f;
    out[14] = (in[2] >> 21) & 0x1f;
    out[15] = (in[2] >> 16) & 0x1f;
    out[16] = (in[2] >> 11) & 0x1f;
    out[17] = (in[2] >> 6) & 0x1f;
    out[18] = (in[2] >> 1) & 0x1f;
    out[19] = (in[2] << 4) & 0x1f;
    out[19] |= in[3] >> 28;
    out[20] = (in[3] >> 23) & 0x1f;
    out[21] = (in[3] >> 18) & 0x1f;
    out[22] = (in[3] >> 13) & 0x1f;
    out[23] = (in[3] >> 8) & 0x1f;
    out[24] = (in[3] >> 3) & 0x1f;
    out[25] = (in[3] << 2) & 0x1f;
    out[25] |= in[4] >> 30;
    out[26] = (in[4] >> 25) & 0x1f;
    out[27] = (in[4] >> 20) & 0x1f;
    out[28] = (in[4] >> 15) & 0x1f;
    out[29] = (in[4] >> 10) & 0x1f;
    out[30] = (in[4] >> 5) & 0x1f;
    out[31] = in[4] & 0x1f;
  }
}